

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  vec3 lookfrom;
  vec3 lookat;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int iVar5;
  bool bVar6;
  vec3 local_258;
  shared_ptr<hittable> local_238;
  double local_220;
  double local_218;
  double local_210;
  undefined1 local_204 [16];
  undefined4 uStack_1f4;
  double dStack_1f0;
  double local_1e8;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  vec3 local_178;
  hittable_list world;
  ray r;
  camera cam;
  
  cornell_box_plus();
  local_178.e[0] = 0.0;
  local_178.e[1] = 0.0;
  local_178.e[2] = 0.0;
  local_258.e[0]._0_4_ = 0xd5;
  local_204._12_4_ = 0x157;
  local_204._8_4_ = 0xe3;
  local_204._4_4_ = 0x14c;
  local_204._0_4_ = 0x22a;
  r.orig.e[0] = 0.0;
  r.orig.e[1] = 0.0;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<material>>
            ((int *)&cam,(int *)&local_258,(int *)(local_204 + 0xc),(int *)(local_204 + 8),
             (int *)(local_204 + 4),(shared_ptr<material> *)local_204);
  local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)cam.origin.e[0];
  local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cam.origin.e[1];
  cam.origin.e[0] = 0.0;
  cam.origin.e[1] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(cam.origin.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(r.orig.e + 1));
  local_198 = 0x4071600000000000;
  uStack_190 = 0x4071600000000000;
  local_1b8 = 0x4071600000000000;
  uStack_1b0 = 0x4071600000000000;
  local_1a8 = 0;
  local_188 = 0xc089000000000000;
  local_1d8 = 0;
  uStack_1d4 = 0;
  uStack_1d0 = 0;
  uStack_1cc = 0x3ff00000;
  local_1c8 = 0;
  lookfrom.e[1] = 278.0;
  lookfrom.e[0] = 278.0;
  lookfrom.e[2] = -800.0;
  lookat.e[1] = 278.0;
  lookat.e[0] = 278.0;
  lookat.e[2] = 0.0;
  camera::camera(&cam,lookfrom,lookat,(vec3)(ZEXT824(0x3ff0000000000000) << 0x40),40.0,2.0,1.0,10.0,
                 0.0,1.0);
  poVar4 = std::operator<<((ostream *)&std::cout,"P3\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,200);
  poVar4 = std::operator<<(poVar4,' ');
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,100);
  std::operator<<(poVar4,"\n255\n");
  for (iVar3 = 99; -1 < iVar3; iVar3 = iVar3 + -1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"\rScanlines remaining: ");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    std::operator<<(poVar4,' ');
    std::ostream::flush();
    local_220 = (double)iVar3;
    for (iVar2 = 0; iVar5 = 100, iVar2 != 200; iVar2 = iVar2 + 1) {
      local_218 = (double)iVar2;
      local_258.e._0_16_ = ZEXT816(0);
      local_258.e[2] = 0.0;
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        dVar1 = random_double();
        local_210 = (dVar1 + local_218) / 200.0;
        dVar1 = random_double();
        camera::get_ray(&r,&cam,local_210,(dVar1 + local_220) / 100.0);
        ray_color((vec3 *)(local_204 + 0xc),&r,&local_178,&world.super_hittable,&local_238,0x32);
        dVar1 = dStack_1f0 + local_258.e[1];
        local_258.e[1]._0_4_ = SUB84(dVar1,0);
        local_258.e[0] = (double)CONCAT44(uStack_1f4,local_204._12_4_) + local_258.e[0];
        local_258.e[1]._4_4_ = (int)((ulong)dVar1 >> 0x20);
        local_258.e[2] = local_1e8 + local_258.e[2];
      }
      vec3::write_color(&local_258,(ostream *)&std::cout,100);
    }
  }
  std::operator<<((ostream *)&std::cerr,"\nDone.\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  hittable_list::~hittable_list(&world);
  return 0;
}

Assistant:

int main() {

    // Image
    const int image_width = 200;
    const int image_height = 100;
    const int samples_per_pixel = 100;
    const int max_depth = 50;
    const auto aspect_ratio = double(image_width) / image_height;

    // World
    //auto world = random_scene();
    //auto world = two_spheres();
    //auto world = two_perlin_spheres();
    //auto world = earth();
    //auto world = simple_light();
    //auto world = cornell_box();
    //auto world = cornell_smoke();
    //auto world = final_scene();
    auto world = cornell_box_plus();

    const vec3 background(0, 0, 0);
    shared_ptr<hittable> lights =
            make_shared<xz_rect>(213, 343, 227, 332, 554, shared_ptr<material>());

    // Camera
    vec3 lookfrom(278, 278, -800);
    vec3 lookat(278, 278, 0);
    vec3 vup(0, 1, 0);
    auto dist_to_focus = 10.0;
    auto aperture = 1.0;
    auto vfov = 40.0;
    auto time0 = 0.0;
    auto time1 = 1.0;

    camera cam(lookfrom, lookat, vup, vfov, aspect_ratio, aperture, dist_to_focus, time0, time1);

    // Render
    std::cout << "P3\n" << image_width << ' ' << image_height << "\n255\n";

    for (int j = image_height - 1; j >= 0; --j) {
        std::cerr << "\rScanlines remaining: " << j << ' ' << std::flush;
        for (int i = 0; i < image_width; ++i) {
            vec3 color(0,0,0);
            for (int s = 0; s < samples_per_pixel; ++s) {
                auto u = (i + random_double()) / image_width;
                auto v = (j + random_double()) / image_height;
                ray r = cam.get_ray(u,v);
                color += ray_color(r, background, world, lights, max_depth);
            }
            color.write_color(std::cout,samples_per_pixel);
        }
    }

    std::cerr << "\nDone.\n";
}